

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

int writeout(FILE **ffp,buffer *bp,char *fn)

{
  int iVar1;
  int *piVar2;
  char local_4c8 [8];
  char dp [1024];
  int eobnl;
  int s;
  line *lpend;
  stat statbuf;
  char *fn_local;
  buffer *bp_local;
  FILE **ffp_local;
  
  statbuf.__glibc_reserved[2] = (__syscall_slong_t)fn;
  iVar1 = stat(fn,(stat *)&lpend);
  if ((iVar1 == -1) && (piVar2 = __errno_location(), *piVar2 == 2)) {
    piVar2 = __errno_location();
    *piVar2 = 0;
    xdirname(local_4c8,(char *)statbuf.__glibc_reserved[2],0x400);
    strlcat(local_4c8,"/",0x400);
    iVar1 = access(local_4c8,2);
    if ((iVar1 != 0) && (piVar2 = __errno_location(), *piVar2 == 0xd)) {
      dobeep();
      ewprintf("Directory %s write-protected",local_4c8);
      return 3;
    }
    piVar2 = __errno_location();
    if (*piVar2 == 2) {
      dobeep();
      ewprintf("%s: no such directory",local_4c8);
      return 3;
    }
  }
  dp[0x3f8] = '\0';
  dp[0x3f9] = '\0';
  dp[0x3fa] = '\0';
  dp[0x3fb] = '\0';
  if (((bp->b_headp->l_bp->l_used == 0) ||
      (dp._1016_4_ = eyorn("No newline at end of file, add one"), dp._1016_4_ == 1)) ||
     (ffp_local._4_4_ = dp._1016_4_, dp._1016_4_ == 0)) {
    dp._1020_4_ = ffwopen(ffp,(char *)statbuf.__glibc_reserved[2],bp);
    if (dp._1020_4_ == 0) {
      dp._1020_4_ = ffputbuf(*ffp,bp,dp._1016_4_);
      if (dp._1020_4_ == 0) {
        dp._1020_4_ = ffclose(*ffp,bp);
        if (dp._1020_4_ == 0) {
          ewprintf("Wrote %s",statbuf.__glibc_reserved[2]);
        }
      }
      else {
        ffclose(*ffp,bp);
        dobeep();
        ewprintf("Unable to write %s",statbuf.__glibc_reserved[2]);
      }
      ffp_local._4_4_ = (uint)(dp._1020_4_ == 0);
    }
    else {
      ffp_local._4_4_ = 0;
    }
  }
  return ffp_local._4_4_;
}

Assistant:

int
writeout(FILE ** ffp, struct buffer *bp, char *fn)
{
	struct stat	 statbuf;
	struct line	*lpend;
	int		 s, eobnl;
	char		 dp[NFILEN];

	if (stat(fn, &statbuf) == -1 && errno == ENOENT) {
		errno = 0;
		(void)xdirname(dp, fn, sizeof(dp));
		(void)strlcat(dp, "/", sizeof(dp));
		if (access(dp, W_OK) && errno == EACCES) {
			dobeep();
			ewprintf("Directory %s write-protected", dp);
			return (FIOERR);
		} else if (errno == ENOENT) {
   			dobeep();
			ewprintf("%s: no such directory", dp);
			return (FIOERR);
		}
        }
	lpend = bp->b_headp;
	eobnl = 0;
	if (llength(lback(lpend)) != 0) {
		eobnl = eyorn("No newline at end of file, add one");
		if (eobnl != TRUE && eobnl != FALSE)
			return (eobnl); /* abort */
	}
	/* open writes message */
	if ((s = ffwopen(ffp, fn, bp)) != FIOSUC)
		return (FALSE);
	s = ffputbuf(*ffp, bp, eobnl);
	if (s == FIOSUC) {
		/* no write error */
		s = ffclose(*ffp, bp);
		if (s == FIOSUC)
			ewprintf("Wrote %s", fn);
	} else {
		/* print a message indicating write error */
		(void)ffclose(*ffp, bp);
		dobeep();
		ewprintf("Unable to write %s", fn);
	}
	return (s == FIOSUC);
}